

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupCof(Aig_Man_t *p,int iInput,int Value)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_50;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int Value_local;
  int iInput_local;
  Aig_Man_t *p_local;
  
  if (p->pManTime == (void *)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    p_00 = Aig_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar2;
    p_00->nAsserts = p->nAsserts;
    p_00->nConstrs = p->nConstrs;
    p_00->nBarBufs = p->nBarBufs;
    if (p->vFlopNums != (Vec_Int_t *)0x0) {
      pVVar3 = Vec_IntDup(p->vFlopNums);
      p_00->vFlopNums = pVVar3;
    }
    Aig_ManCleanData(p);
    pAVar4 = Aig_ManConst1(p_00);
    pAVar5 = Aig_ManConst1(p);
    (pAVar5->field_5).pData = pAVar4;
    for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar6 = Vec_PtrEntry(p->vCis,local_34);
      if (local_34 == iInput) {
        if (Value == 0) {
          local_50 = Aig_ManConst0(p_00);
        }
        else {
          local_50 = Aig_ManConst1(p_00);
        }
        pAStack_30 = local_50;
      }
      else {
        pAStack_30 = Aig_ObjCreateCi(p_00);
        *(ulong *)&pAStack_30->field_0x18 =
             *(ulong *)&pAStack_30->field_0x18 & 0xff000000ffffffff |
             (ulong)((uint)((ulong)*(undefined8 *)((long)pvVar6 + 0x18) >> 0x20) & 0xffffff) << 0x20
        ;
      }
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAStack_30;
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        iVar1 = Aig_ObjIsBuf(pAVar4);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsNode(pAVar4);
          if (iVar1 != 0) {
            pAVar5 = Aig_ObjChild0Copy(pAVar4);
            p1 = Aig_ObjChild1Copy(pAVar4);
            pAVar5 = Aig_And(p_00,pAVar5,p1);
            (pAVar4->field_5).pData = pAVar5;
          }
        }
        else {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCos), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
      (pAVar4->field_5).pData = pAVar5;
    }
    Aig_ManCleanup(p_00);
    iVar1 = Aig_ManRegNum(p);
    Aig_ManSetRegNum(p_00,iVar1);
    iVar1 = Aig_ManCheck(p_00);
    if (iVar1 == 0) {
      printf("Aig_ManDupSimple(): The check has failed.\n");
    }
    return p_00;
  }
  __assert_fail("p->pManTime == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                ,0x15e,"Aig_Man_t *Aig_ManDupCof(Aig_Man_t *, int, int)");
}

Assistant:

Aig_Man_t * Aig_ManDupCof( Aig_Man_t * p, int iInput, int Value )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    assert( p->pManTime == NULL );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( i == iInput )
            pObjNew = Value ? Aig_ManConst1(pNew) : Aig_ManConst0(pNew);
        else
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            pObj->pData = pObjNew;
        }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
//    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}